

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort_mkq.cpp
# Opt level: O3

bool verify_tst<std::vector<unsigned_char*,std::allocator<unsigned_char*>>,unsigned_short>
               (TSTNode<unsigned_short> *node,size_t depth)

{
  long *plVar1;
  long lVar2;
  char *pcVar3;
  undefined1 extraout_AL;
  ushort uVar4;
  unsigned_short uVar5;
  ostream *poVar6;
  size_t sVar7;
  long lVar8;
  ushort uVar9;
  unsigned_short uVar10;
  long lVar11;
  DI __d;
  char local_49;
  TSTNode<unsigned_short> *local_48;
  DI local_40;
  size_t local_38;
  
  uVar10 = node->pivot;
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                      __debug_indent_str_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"verify_tst",10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"() pivot=",9);
  local_48 = node;
  if (uVar10 == 0) {
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,(uint)node->pivot);
  }
  else {
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," depth=",7);
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  local_40.i._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)&local_40,1);
  local_40.i = &__debug_indent_str_abi_cxx11_;
  std::__cxx11::string::append((char *)&__debug_indent_str_abi_cxx11_);
  local_38 = depth;
  if (((local_48->is_tst).super__Base_bitset<1UL>._M_w & 1) == 0) {
    plVar1 = (long *)(local_48->buckets)._M_elems[0];
    if (plVar1 == (long *)0x0) {
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                          __debug_indent_str_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"verify_bucket",0xd);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"() buckets[",0xb);
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"] == NULL",9);
      local_49 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,&local_49,1);
    }
    else {
      lVar8 = *plVar1;
      lVar2 = plVar1[1];
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                          __debug_indent_str_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"verify_bucket",0xd);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"() buckets[",0xb);
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"].size()=",9);
      lVar11 = lVar2 - lVar8 >> 3;
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      local_49 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,&local_49,1);
      if (lVar2 != lVar8) {
        lVar8 = 0;
        do {
          lVar2 = *(long *)(*plVar1 + lVar8 * 8);
          if (lVar2 == 0) goto LAB_00215e3d;
          if (*(char *)(lVar2 + depth) == '\0') {
            uVar9 = 0;
          }
          else {
            uVar9 = CONCAT11(*(char *)(lVar2 + depth),*(undefined1 *)(lVar2 + 1 + depth));
          }
          uVar4 = local_48->pivot;
          if (uVar4 <= uVar9) {
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p
                                ,__debug_indent_str_abi_cxx11_._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,"INVALID: ",9);
            pcVar3 = *(char **)(*plVar1 + lVar8 * 8);
            if (pcVar3 == (char *)0x0) {
              std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
            }
            else {
              sVar7 = strlen(pcVar3);
              std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar3,sVar7);
            }
            std::__ostream_insert<char,std::char_traits<char>>(poVar6," [pivot=",8);
            poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,"]",1);
            local_49 = '\n';
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,&local_49,1);
            uVar4 = local_48->pivot;
            depth = local_38;
          }
          if (uVar4 <= uVar9) {
            __assert_fail("ch < node->pivot",
                          "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort_mkq.cpp"
                          ,0xb7,
                          "bool verify_bucket(TSTNode<CharT> *, size_t) [BucketNum = 0U, BucketT = std::vector<unsigned char *>, CharT = unsigned short]"
                         );
          }
          lVar8 = lVar8 + 1;
        } while (lVar11 + (ulong)(lVar11 == 0) != lVar8);
      }
    }
  }
  else {
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                        __debug_indent_str_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"verify_bucket",0xd);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"() buckets[",0xb);
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"] is TST",8);
    local_49 = '\n';
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,&local_49,1);
    verify_tst<std::vector<unsigned_char*,std::allocator<unsigned_char*>>,unsigned_short>
              ((TSTNode<unsigned_short> *)(local_48->buckets)._M_elems[0],depth);
  }
  if (((local_48->is_tst).super__Base_bitset<1UL>._M_w & 2) == 0) {
    plVar1 = (long *)(local_48->buckets)._M_elems[1];
    if (plVar1 == (long *)0x0) {
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                          __debug_indent_str_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"verify_bucket",0xd);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"() buckets[",0xb);
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"] == NULL",9);
      local_49 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,&local_49,1);
    }
    else {
      lVar8 = *plVar1;
      lVar2 = plVar1[1];
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                          __debug_indent_str_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"verify_bucket",0xd);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"() buckets[",0xb);
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"].size()=",9);
      lVar11 = lVar2 - lVar8 >> 3;
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      local_49 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,&local_49,1);
      if (lVar2 != lVar8) {
        lVar8 = 0;
        do {
          lVar2 = *(long *)(*plVar1 + lVar8 * 8);
          if (lVar2 == 0) goto LAB_00215e3d;
          if (*(char *)(lVar2 + depth) == '\0') {
            uVar10 = 0;
          }
          else {
            uVar10 = CONCAT11(*(char *)(lVar2 + depth),*(undefined1 *)(lVar2 + 1 + depth));
          }
          uVar5 = uVar10;
          if (uVar10 != local_48->pivot) {
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p
                                ,__debug_indent_str_abi_cxx11_._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,"INVALID: ",9);
            pcVar3 = *(char **)(*plVar1 + lVar8 * 8);
            if (pcVar3 == (char *)0x0) {
              std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
            }
            else {
              sVar7 = strlen(pcVar3);
              std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar3,sVar7);
            }
            std::__ostream_insert<char,std::char_traits<char>>(poVar6," [pivot=",8);
            poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,"]",1);
            local_49 = '\n';
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,&local_49,1);
            uVar5 = local_48->pivot;
            depth = local_38;
          }
          if (uVar10 != uVar5) {
            __assert_fail("ch == node->pivot",
                          "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort_mkq.cpp"
                          ,0xbd,
                          "bool verify_bucket(TSTNode<CharT> *, size_t) [BucketNum = 1U, BucketT = std::vector<unsigned char *>, CharT = unsigned short]"
                         );
          }
          lVar8 = lVar8 + 1;
        } while (lVar11 + (ulong)(lVar11 == 0) != lVar8);
      }
    }
  }
  else {
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                        __debug_indent_str_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"verify_bucket",0xd);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"() buckets[",0xb);
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"] is TST",8);
    local_49 = '\n';
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,&local_49,1);
    verify_tst<std::vector<unsigned_char*,std::allocator<unsigned_char*>>,unsigned_short>
              ((TSTNode<unsigned_short> *)(local_48->buckets)._M_elems[1],depth + 2);
  }
  if (((local_48->is_tst).super__Base_bitset<1UL>._M_w & 4) == 0) {
    plVar1 = (long *)(local_48->buckets)._M_elems[2];
    if (plVar1 == (long *)0x0) {
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                          __debug_indent_str_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"verify_bucket",0xd);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"() buckets[",0xb);
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"] == NULL",9);
      local_49 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,&local_49,1);
    }
    else {
      lVar8 = *plVar1;
      lVar2 = plVar1[1];
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                          __debug_indent_str_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"verify_bucket",0xd);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"() buckets[",0xb);
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"].size()=",9);
      lVar11 = lVar2 - lVar8 >> 3;
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      local_49 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,&local_49,1);
      if (lVar2 != lVar8) {
        lVar8 = 0;
        do {
          lVar2 = *(long *)(*plVar1 + lVar8 * 8);
          if (lVar2 == 0) {
LAB_00215e3d:
            __assert_fail("ptr",
                          "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/util/get_char.h"
                          ,0x2e,"uint16_t get_char(unsigned char *, size_t)");
          }
          if (*(char *)(lVar2 + depth) == '\0') {
            uVar9 = 0;
LAB_00215c29:
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p
                                ,__debug_indent_str_abi_cxx11_._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,"INVALID: ",9);
            pcVar3 = *(char **)(*plVar1 + lVar8 * 8);
            if (pcVar3 == (char *)0x0) {
              std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
            }
            else {
              sVar7 = strlen(pcVar3);
              std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar3,sVar7);
            }
            std::__ostream_insert<char,std::char_traits<char>>(poVar6," [pivot=",8);
            poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,"]",1);
            local_49 = '\n';
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,&local_49,1);
            uVar4 = local_48->pivot;
            depth = local_38;
          }
          else {
            uVar9 = CONCAT11(*(char *)(lVar2 + depth),*(undefined1 *)(lVar2 + 1 + depth));
            uVar4 = local_48->pivot;
            if (uVar9 <= uVar4) goto LAB_00215c29;
          }
          if (uVar9 <= uVar4) {
            __assert_fail("ch > node->pivot",
                          "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort_mkq.cpp"
                          ,0xc3,
                          "bool verify_bucket(TSTNode<CharT> *, size_t) [BucketNum = 2U, BucketT = std::vector<unsigned char *>, CharT = unsigned short]"
                         );
          }
          lVar8 = lVar8 + 1;
        } while (lVar11 + (ulong)(lVar11 == 0) != lVar8);
      }
    }
  }
  else {
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                        __debug_indent_str_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"verify_bucket",0xd);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"() buckets[",0xb);
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"] is TST",8);
    local_49 = '\n';
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,&local_49,1);
    verify_tst<std::vector<unsigned_char*,std::allocator<unsigned_char*>>,unsigned_short>
              ((TSTNode<unsigned_short> *)(local_48->buckets)._M_elems[2],depth);
  }
  verify_tst<std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>,_unsigned_short>::DI::
  ~DI(&local_40);
  return (bool)extraout_AL;
}

Assistant:

static bool
verify_tst(TSTNode<CharT>* node, size_t depth)
{
	if (node->pivot)
		debug() << __func__ << "() pivot=" << node->pivot << " depth=" << depth << '\n';
	else
		debug() << __func__ << "() pivot=" << int(node->pivot) << " depth=" << depth << '\n';
	debug_indent;
	verify_bucket<0, BucketT, CharT>(node, depth);
	verify_bucket<1, BucketT, CharT>(node, depth);
	verify_bucket<2, BucketT, CharT>(node, depth);
	return true;
}